

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O0

QSize __thiscall QLabel::minimumSizeHint(QLabel *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QSizePolicy QVar4;
  QLabelPrivate *pQVar5;
  QSize QVar6;
  int *piVar7;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QLabelPrivate *d;
  QLabelPrivate *in_stack_00000038;
  QSize msh;
  int in_stack_000001cc;
  undefined8 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_14;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QLabel *)0x5b064a);
  if ((*(ushort *)&pQVar5->field_0x340 & 1) != 0) {
    local_14.bits =
         (Bits)QWidget::sizePolicy((QWidget *)
                                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    bVar1 = QSizePolicy::operator==(&pQVar5->sizePolicy,(QSizePolicy *)&local_14.bits);
    if (bVar1) {
      local_10 = pQVar5->msh;
      goto LAB_005b082a;
    }
  }
  QWidget::ensurePolished(in_RDI);
  *(ushort *)&pQVar5->field_0x340 = *(ushort *)&pQVar5->field_0x340 & 0xfffe | 1;
  QVar6 = QLabelPrivate::sizeForWidth(in_stack_00000038,in_stack_000001cc);
  pQVar5->sh = QVar6;
  local_10 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  QSize::QSize((QSize *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(int)in_stack_ffffffffffffff98);
  if ((*(ushort *)&pQVar5->field_0x340 >> 4 & 1) == 0) {
    local_10 = pQVar5->sh;
  }
  else {
    QLabelPrivate::sizeForWidth(in_stack_00000038,in_stack_000001cc);
    in_stack_ffffffffffffffa4 = QSize::height((QSize *)0x5b0769);
    piVar7 = QSize::rheight((QSize *)0x5b0777);
    *piVar7 = in_stack_ffffffffffffffa4;
    QLabelPrivate::sizeForWidth(in_stack_00000038,in_stack_000001cc);
    iVar2 = QSize::width((QSize *)0x5b0798);
    piVar7 = QSize::rwidth((QSize *)0x5b07a6);
    *piVar7 = iVar2;
    iVar2 = QSize::height((QSize *)0x5b07bd);
    iVar3 = QSize::height((QSize *)0x5b07cb);
    if (iVar2 < iVar3) {
      in_stack_ffffffffffffffa0 = QSize::height((QSize *)0x5b07e6);
      piVar7 = QSize::rheight((QSize *)0x5b07f4);
      *piVar7 = in_stack_ffffffffffffffa0;
    }
  }
  pQVar5->msh = local_10;
  QVar4 = QWidget::sizePolicy((QWidget *)
                              CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  (pQVar5->sizePolicy).field_0.bits = (Bits)QVar4.field_0;
LAB_005b082a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

QSize QLabel::minimumSizeHint() const
{
    Q_D(const QLabel);
    if (d->valid_hints) {
        if (d->sizePolicy == sizePolicy())
            return d->msh;
    }

    ensurePolished();
    d->valid_hints = true;
    d->sh = d->sizeForWidth(-1); // wrap ? golden ratio : min doc size
    QSize msh(-1, -1);

    if (!d->isTextLabel) {
        msh = d->sh;
    } else {
        msh.rheight() = d->sizeForWidth(QWIDGETSIZE_MAX).height(); // height for one line
        msh.rwidth() = d->sizeForWidth(0).width(); // wrap ? size of biggest word : min doc size
        if (d->sh.height() < msh.height())
            msh.rheight() = d->sh.height();
    }
    d->msh = msh;
    d->sizePolicy = sizePolicy();
    return msh;
}